

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int normal_scanPercent(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  int iVar2;
  char **ppcVar3;
  long lVar4;
  uint uVar5;
  char *pcVar6;
  int iVar7;
  int iVar8;
  
  ppcVar3 = (char **)(end + -(long)ptr);
  if ((long)ppcVar3 < 1) {
    return -1;
  }
  bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
  iVar7 = 0;
  uVar5 = bVar1 - 5;
  if (uVar5 < 0x14) {
    pcVar6 = (char *)((long)&switchD_00409030::switchdataD_0057b528 +
                     (long)(int)(&switchD_00409030::switchdataD_0057b528)[uVar5]);
    iVar8 = 0;
    switch((uint)bVar1) {
    case 5:
      iVar8 = -2;
      if (ppcVar3 != (char **)0x1) {
        iVar2 = (*enc[3].literalScanners[0])(enc,ptr,pcVar6,ppcVar3);
        while( true ) {
          lVar4 = 2;
          while( true ) {
            iVar8 = iVar7;
            if (iVar2 == 0) goto switchD_00409030_caseD_8;
LAB_004090b0:
            while( true ) {
              ptr = (char *)((byte *)ptr + lVar4);
              lVar4 = (long)end - (long)ptr;
              if (lVar4 < 1) {
                return -1;
              }
              ppcVar3 = (char **)(ulong)(byte)*ptr;
              bVar1 = *(byte *)((long)enc[1].scanners + (long)ppcVar3);
              pcVar6 = (char *)(ulong)bVar1;
              if (bVar1 < 0x12) break;
              lVar4 = 1;
              if ((3 < bVar1 - 0x18) && (bVar1 != 0x16)) {
                iVar8 = iVar7;
                if (bVar1 == 0x12) {
                  ptr = (char *)((byte *)ptr + 1);
                  iVar8 = 0x1c;
                }
                goto switchD_00409030_caseD_8;
              }
            }
            if (bVar1 == 5) break;
            if (bVar1 == 6) {
              if (lVar4 < 3) goto LAB_0040916c;
              iVar2 = (*enc[3].scanners[1])(enc,ptr,pcVar6,ppcVar3);
LAB_00409136:
              lVar4 = 3;
            }
            else {
              iVar8 = iVar7;
              if (bVar1 != 7) goto switchD_00409030_caseD_8;
              if (lVar4 < 4) goto LAB_0040916c;
              iVar2 = (*enc[3].scanners[2])(enc,ptr,pcVar6,ppcVar3);
LAB_00409114:
              lVar4 = 4;
            }
          }
          if (lVar4 == 1) break;
          iVar2 = (*enc[3].scanners[0])(enc,ptr,pcVar6,ppcVar3);
        }
LAB_0040916c:
        iVar8 = -2;
      }
      break;
    case 6:
      iVar8 = -2;
      if (2 < (long)ppcVar3) {
        iVar2 = (*enc[3].literalScanners[1])(enc,ptr,pcVar6,ppcVar3);
        goto LAB_00409136;
      }
      break;
    case 7:
      iVar8 = -2;
      if (3 < (long)ppcVar3) {
        iVar2 = (*enc[3].nameMatchesAscii)(enc,ptr,pcVar6,(char *)ppcVar3);
        goto LAB_00409114;
      }
      break;
    default:
      goto switchD_00409030_caseD_8;
    case 9:
    case 10:
    case 0x15:
      goto switchD_00409030_caseD_9;
    case 0x16:
    case 0x18:
      lVar4 = 1;
      goto LAB_004090b0;
    }
  }
  else {
    iVar8 = iVar7;
    if (bVar1 == 0x1e) {
switchD_00409030_caseD_9:
      iVar8 = 0x16;
    }
switchD_00409030_caseD_8:
    *nextTokPtr = ptr;
  }
  return iVar8;
}

Assistant:

static int PTRCALL
PREFIX(scanPercent)(const ENCODING *enc, const char *ptr, const char *end,
                    const char **nextTokPtr)
{
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_S: case BT_LF: case BT_CR: case BT_PERCNT:
    *nextTokPtr = ptr;
    return XML_TOK_PERCENT;
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_SEMI:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_PARAM_ENTITY_REF;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}